

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinputsimulatorimpllinux.cpp
# Opt level: O0

void __thiscall XInputSimulatorImplLinux::mouseMoveTo(XInputSimulatorImplLinux *this,int x,int y)

{
  int res_ev_sync;
  int res_w;
  input_event ev_sync;
  input_event ev [2];
  int y_local;
  int x_local;
  XInputSimulatorImplLinux *this_local;
  
  if (this->display != (Display *)0x0) {
    memset(&ev_sync.type,0,0x30);
    memset(&res_ev_sync,0,0x18);
    write(this->fd,&ev_sync.type,0x30);
    ev_sync.time.tv_usec._0_2_ = 0;
    ev_sync.time.tv_usec._4_4_ = 0;
    ev_sync.time.tv_usec._2_2_ = 0;
    write(this->fd,&res_ev_sync,0x18);
  }
  return;
}

Assistant:

void XInputSimulatorImplLinux::mouseMoveTo(int x, int y)
{
    if(!display){
        return;
    }

    struct input_event ev[2], ev_sync;
    memset(ev, 0, sizeof(ev));
    memset(&ev_sync, 0, sizeof(ev_sync));

    ev[0].type = EV_ABS;
    ev[0].code = ABS_X;
    ev[0].value = x;
    ev[1].type = EV_ABS;
    ev[1].code = ABS_Y;
    ev[1].value = y;


    int res_w = write(fd, ev, sizeof(ev));

    ev_sync.type = EV_SYN;
    ev_sync.value = 0;
    ev_sync.code = 0;
    int res_ev_sync = write(fd, &ev_sync, sizeof(ev_sync));

  /*  XWarpPointer(display, None, root, 0, 0, 0, 0, x, y);
    XFlush(display);


    XEvent event;
    memset(&event, 0, sizeof (event));*/
}